

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_export_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  long in_RSI;
  mbedtls_mpi *in_R8;
  mbedtls_mpi_sint in_R9;
  int is_priv;
  int ret;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  int local_4;
  
  local_4 = 0;
  iVar1 = mbedtls_mpi_cmp_int(in_R8,in_R9);
  uVar3 = false;
  if (iVar1 != 0) {
    iVar1 = mbedtls_mpi_cmp_int(in_R8,in_R9);
    uVar3 = false;
    if (iVar1 != 0) {
      iVar1 = mbedtls_mpi_cmp_int(in_R8,in_R9);
      uVar3 = false;
      if (iVar1 != 0) {
        iVar1 = mbedtls_mpi_cmp_int(in_R8,in_R9);
        uVar3 = false;
        if (iVar1 != 0) {
          iVar1 = mbedtls_mpi_cmp_int(in_R8,in_R9);
          uVar3 = iVar1 != 0;
        }
      }
    }
  }
  uVar2 = (uint)(byte)uVar3;
  if ((uVar2 == 0) && (((in_RCX != 0 || (in_R9 != 0)) || (Q != (uchar *)0x0)))) {
    local_4 = -0x4080;
  }
  else if ((((((in_RSI == 0) ||
              (local_4 = mbedtls_mpi_write_binary
                                   ((mbedtls_mpi *)CONCAT44(local_4,uVar2),
                                    (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),0x272f0d8),
              local_4 == 0)) &&
             ((in_RCX == 0 ||
              (local_4 = mbedtls_mpi_write_binary
                                   ((mbedtls_mpi *)CONCAT44(local_4,uVar2),
                                    (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),0x272f10c),
              local_4 == 0)))) &&
            ((in_R9 == 0 ||
             (local_4 = mbedtls_mpi_write_binary
                                  ((mbedtls_mpi *)CONCAT44(local_4,uVar2),
                                   (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),0x272f140),
             local_4 == 0)))) &&
           ((Q == (uchar *)0x0 ||
            (local_4 = mbedtls_mpi_write_binary
                                 ((mbedtls_mpi *)CONCAT44(local_4,uVar2),
                                  (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),0x272f171),
            local_4 == 0)))) && (P != (uchar *)0x0)) {
    local_4 = mbedtls_mpi_write_binary
                        ((mbedtls_mpi *)CONCAT44(local_4,uVar2),
                         (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),0x272f1a2);
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_export_raw(const mbedtls_rsa_context *ctx,
                           unsigned char *N, size_t N_len,
                           unsigned char *P, size_t P_len,
                           unsigned char *Q, size_t Q_len,
                           unsigned char *D, size_t D_len,
                           unsigned char *E, size_t E_len)
{
    int ret = 0;
    int is_priv;

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int(&ctx->N, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->P, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->D, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->E, 0) != 0;

    if (!is_priv) {
        /* If we're trying to export private parameters for a public key,
         * something must be wrong. */
        if (P != NULL || Q != NULL || D != NULL) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

    }

    if (N != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->N, N, N_len));
    }

    if (P != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->P, P, P_len));
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->Q, Q, Q_len));
    }

    if (D != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->D, D, D_len));
    }

    if (E != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->E, E, E_len));
    }

cleanup:

    return ret;
}